

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O1

int aes_test_alignment_detection(uint n)

{
  int iVar1;
  uint uVar2;
  undefined1 *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 local_48 [24];
  uint8_t p [16];
  
  uVar2 = 1;
  if (0xfffffff2 < n - 0x11) {
    if (n == 0) {
      iVar4 = 0;
      bVar11 = true;
    }
    else {
      puVar3 = local_48;
      iVar1 = (int)puVar3;
      lVar6 = 0;
      iVar4 = 0;
      iVar5 = 0;
      puVar7 = puVar3;
      do {
        uVar8 = (ulong)((uint)puVar3 & n - 1);
        uVar10 = (ulong)((int)lVar6 - iVar1 & n - 1);
        uVar9 = -uVar8;
        if ((uVar10 != uVar9) && (puVar7 + (n - uVar8) != puVar7 + uVar10)) {
          return 1;
        }
        iVar4 = iVar4 + (uint)(uVar10 != uVar9 && puVar7 + (n - uVar8) == puVar7 + uVar10);
        iVar5 = iVar5 + (uint)(uVar10 == uVar9);
        puVar7 = puVar7 + 1;
        lVar6 = lVar6 + -1;
        puVar3 = puVar3 + 1;
      } while ((ulong)n + lVar6 != 0);
      bVar11 = iVar5 != 1;
    }
    uVar2 = (uint)(byte)(iVar4 != n - 1 | bVar11);
  }
  return uVar2;
}

Assistant:

AES_RETURN aes_test_alignment_detection(unsigned int n)	/* 4 <= n <= 16 */
{	uint8_t	p[16];
    uint32_t i, count_eq = 0, count_neq = 0;

    if(n < 4 || n > 16)
        return EXIT_FAILURE;

    for(i = 0; i < n; ++i)
    {
        uint8_t *qf = ALIGN_FLOOR(p + i, n),
                *qh =  ALIGN_CEIL(p + i, n);
        
        if(qh == qf)
            ++count_eq;
        else if(qh == qf + n)
            ++count_neq;
        else
            return EXIT_FAILURE;
    }
    return (count_eq != 1 || count_neq != n - 1 ? EXIT_FAILURE : EXIT_SUCCESS);
}